

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTrapeziumProfileDef::~IfcTrapeziumProfileDef
          (IfcTrapeziumProfileDef *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   ((long)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.ProfileName.ptr.field_2 + 8
   ) = 0x91b178;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.ptr._M_dataplus._M_p =
       "z4Q";
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.field_0x78;
  if ((Out *)puVar1 != &this[-1].TopXDim) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x58
  ;
  if (puVar1 != &this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.field_0x68) {
    operator_delete(puVar1);
  }
  operator_delete((void *)((long)&this[-1].super_IfcParameterizedProfileDef.super_IfcProfileDef.
                                  ProfileName.ptr.field_2 + 8));
  return;
}

Assistant:

IfcTrapeziumProfileDef() : Object("IfcTrapeziumProfileDef") {}